

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_tec_edg_zone(REF_GRID ref_grid,FILE *file)

{
  uint uVar1;
  REF_STATUS RVar2;
  REF_STATUS local_f0;
  REF_STATUS local_ec;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT boundary_index;
  REF_INT boundary_tag;
  REF_DICT ref_dict;
  int local_c0;
  REF_INT nnode;
  REF_INT cell_node;
  REF_INT cell;
  REF_INT nodes [27];
  REF_INT nedge;
  REF_INT *l2g;
  REF_INT *g2l;
  REF_CELL pRStack_30;
  REF_INT node;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  FILE *file_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  ref_node = (REF_NODE)file;
  file_local = (FILE *)ref_grid;
  uVar1 = ref_dict_create((REF_DICT *)&boundary_index);
  if (uVar1 == 0) {
    pRStack_30 = (REF_CELL)file_local->_IO_read_end;
    for (nnode = 0; nnode < pRStack_30->max; nnode = nnode + 1) {
      RVar2 = ref_cell_nodes(pRStack_30,nnode,&cell_node);
      if ((RVar2 == 0) &&
         (uVar1 = ref_dict_store(_boundary_index,(&cell_node)[pRStack_30->node_per],-1), uVar1 != 0)
         ) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0xf3,"ref_export_tec_edg_zone",(ulong)uVar1,"mark tri");
        return uVar1;
      }
    }
    ref_private_macro_code_rss_1 = 0;
    if (_boundary_index->n < 1) {
      local_ec = -1;
    }
    else {
      local_ec = *_boundary_index->key;
    }
    ref_private_macro_code_rss = local_ec;
    while (ref_private_macro_code_rss_1 < _boundary_index->n) {
      uVar1 = ref_grid_cell_id_nodes
                        ((REF_GRID)file_local,pRStack_30,ref_private_macro_code_rss,
                         (REF_INT *)((long)&ref_dict + 4),nodes + 0x19,&l2g,
                         (REF_INT **)(nodes + 0x1a));
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0xf9,"ref_export_tec_edg_zone",(ulong)uVar1,"extract this edge");
        return uVar1;
      }
      fprintf((FILE *)ref_node,
              "zone t=\"edge%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
              (ulong)(uint)ref_private_macro_code_rss,(ulong)ref_dict._4_4_,(ulong)(uint)nodes[0x19]
              ,"point","felineseg");
      for (g2l._4_4_ = 0; g2l._4_4_ < (int)ref_dict._4_4_; g2l._4_4_ = g2l._4_4_ + 1) {
        fprintf((FILE *)ref_node," %.16e %.16e %.16e\n",
                *(undefined8 *)
                 (ref_cell->c2n +
                 (long)(*(int *)((long)stack0xffffffffffffffb8 + (long)g2l._4_4_ * 4) * 0xf) * 2),
                *(undefined8 *)
                 (ref_cell->c2n +
                 (long)(*(int *)((long)stack0xffffffffffffffb8 + (long)g2l._4_4_ * 4) * 0xf + 1) * 2
                 ),*(undefined8 *)
                    (ref_cell->c2n +
                    (long)(*(int *)((long)stack0xffffffffffffffb8 + (long)g2l._4_4_ * 4) * 0xf + 2)
                    * 2));
      }
      for (nnode = 0; nnode < pRStack_30->max; nnode = nnode + 1) {
        RVar2 = ref_cell_nodes(pRStack_30,nnode,&cell_node);
        if ((RVar2 == 0) && (ref_private_macro_code_rss == (&cell_node)[pRStack_30->node_per])) {
          for (local_c0 = 0; local_c0 < pRStack_30->node_per; local_c0 = local_c0 + 1) {
            fprintf((FILE *)ref_node," %d",(ulong)(l2g[(&cell_node)[local_c0]] + 1));
          }
          fprintf((FILE *)ref_node,"\n");
        }
      }
      if (stack0xffffffffffffffb8 != (void *)0x0) {
        free(stack0xffffffffffffffb8);
      }
      if (l2g != (REF_INT *)0x0) {
        free(l2g);
      }
      ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1;
      if ((ref_private_macro_code_rss_1 < 0) || (_boundary_index->n <= ref_private_macro_code_rss_1)
         ) {
        local_f0 = -1;
      }
      else {
        local_f0 = _boundary_index->key[ref_private_macro_code_rss_1];
      }
      ref_private_macro_code_rss = local_f0;
    }
    ref_grid_local._4_4_ = ref_dict_free(_boundary_index);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x113,"ref_export_tec_edg_zone",(ulong)ref_grid_local._4_4_,"free dict");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0xee,
           "ref_export_tec_edg_zone",(ulong)uVar1,"create dict");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_export_tec_edg_zone(REF_GRID ref_grid,
                                                  FILE *file) {
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT *g2l, *l2g;
  REF_INT nedge;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell, cell_node;
  REF_INT nnode;
  REF_DICT ref_dict;
  REF_INT boundary_tag, boundary_index;

  ref_node = ref_grid_node(ref_grid);

  RSS(ref_dict_create(&ref_dict), "create dict");

  ref_cell = ref_grid_edg(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_dict_store(ref_dict, nodes[ref_cell_id_index(ref_cell)], REF_EMPTY),
        "mark tri");
  }

  each_ref_dict_key(ref_dict, boundary_index, boundary_tag) {
    RSS(ref_grid_cell_id_nodes(ref_grid, ref_cell, boundary_tag, &nnode, &nedge,
                               &g2l, &l2g),
        "extract this edge");

    fprintf(file,
            "zone t=\"edge%d\", nodes=%d, elements=%d, datapacking=%s, "
            "zonetype=%s\n",
            boundary_tag, nnode, nedge, "point", "felineseg");

    for (node = 0; node < nnode; node++)
      fprintf(file, " %.16e %.16e %.16e\n",
              ref_node_xyz(ref_node, 0, l2g[node]),
              ref_node_xyz(ref_node, 1, l2g[node]),
              ref_node_xyz(ref_node, 2, l2g[node]));

    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (boundary_tag == nodes[ref_cell_id_index(ref_cell)]) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          fprintf(file, " %d", g2l[nodes[cell_node]] + 1);
        }
        fprintf(file, "\n");
      }
    }

    ref_free(l2g);
    ref_free(g2l);
  }

  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}